

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

int __thiscall Epanet::Project::openOutput(Project *this,char *fname)

{
  string *psVar1;
  string local_50 [32];
  
  if (this->networkEmpty == false) {
    OutputFile::close(&this->outputFile,(int)fname);
    this->outputFileOpened = false;
    psVar1 = &this->outFileName;
    std::__cxx11::string::assign((char *)psVar1);
    if (*fname == '\0') {
      std::__cxx11::string::_M_assign((string *)psVar1);
    }
    std::__cxx11::string::string(local_50,(string *)psVar1);
    OutputFile::open(&this->outputFile,(char *)local_50,(int)this);
    std::__cxx11::string::~string(local_50);
    this->outputFileOpened = true;
  }
  return 0;
}

Assistant:

int Project::openOutput(const char* fname)
    {
        //... close an already opened output file
        if ( networkEmpty ) return 0;
        outputFile.close();
        outputFileOpened = false;

        // ... save the name of the output file
        outFileName = fname;
        if ( strlen(fname) == 0 ) outFileName = tmpFileName;

        // ... open the file
        try
        {
            outputFile.open(outFileName, &network);
            outputFileOpened = true;
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }